

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

ssize_t __thiscall parser::state::read(state *this,int __fd,void *__buf,size_t __nbytes)

{
  stream_type *psVar1;
  ind iVar2;
  long lVar3;
  long lVar4;
  deque<char,std::allocator<char>> *this_00;
  size_type sVar5;
  char *__first;
  undefined4 in_register_00000034;
  long lVar6;
  undefined8 uStack_90;
  const_iterator local_88;
  iterator local_60;
  state *local_40;
  deque<char,std::allocator<char>> *local_38;
  
  lVar4 = -(CONCAT44(in_register_00000034,__fd) + 0xfU & 0xfffffffffffffff0);
  __first = (char *)((long)&local_88 + lVar4);
  psVar1 = this->in;
  *(undefined8 *)((long)&uStack_90 + lVar4) = 0x12b8c5;
  std::istream::read((char *)psVar1,(long)__first);
  iVar2 = (this->off).i;
  lVar3 = *(long *)(this->in + 8);
  local_38 = (deque<char,std::allocator<char>> *)&this->str;
  *(undefined8 *)((long)&uStack_90 + lVar4) = 0x12b8e4;
  sVar5 = std::deque<char,_std::allocator<char>_>::size(&this->str);
  local_40 = this;
  for (lVar6 = 0; this_00 = local_38, lVar3 != lVar6; lVar6 = lVar6 + 1) {
    if (__first[lVar6] == '\n') {
      local_60._M_cur = (_Elt_pointer)(iVar2 + sVar5 + 1 + lVar6);
      *(undefined8 *)((long)&uStack_90 + lVar4) = 0x12b919;
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&this->lines,(unsigned_long *)&local_60);
    }
  }
  local_88._M_cur =
       (local_40->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data
       ._M_finish._M_cur;
  local_88._M_first =
       (local_40->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data
       ._M_finish._M_first;
  local_88._M_last =
       (local_40->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data
       ._M_finish._M_last;
  local_88._M_node =
       (local_40->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data
       ._M_finish._M_node;
  *(undefined8 *)((long)&uStack_90 + lVar4) = 0x12b949;
  std::deque<char,std::allocator<char>>::insert<char*,void>
            (&local_60,this_00,&local_88,__first,__first + lVar3);
  return lVar3;
}

Assistant:

ind read(ind n) {
			value_type s[n];
			// Read into buffer
			in.read(s, n);
			// Count read characters
			ind r = in.gcount();
			// Track newlines
			ind i_max = off.i + str.size();
			for (ind i = 0; i < r; ++i) {
				if ( s[i] == '\n' ) { lines.push_back(i_max + i + 1); }
			}
			// Add to stored input
			str.insert(str.end(), s, s+r);
			return r;
		}